

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_ntop.c
# Opt level: O1

char * sock_ntop(sockaddr *sa,socklen_t salen)

{
  ushort uVar1;
  ulong in_RAX;
  char *pcVar2;
  size_t __maxlen;
  char portstr [8];
  ulong uStack_18;
  
  uVar1 = sa->sa_family;
  uStack_18 = in_RAX;
  if (uVar1 == 10) {
    sock_ntop::str[0] = '[';
    pcVar2 = inet_ntop(10,sa->sa_data + 6,sock_ntop::str + 1,0x7f);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    uVar1 = *(ushort *)sa->sa_data;
    if (uVar1 == 0) {
      return sock_ntop::str + 1;
    }
    uVar1 = uVar1 << 8 | uVar1 >> 8;
    pcVar2 = "]:%d";
    __maxlen = 8;
  }
  else {
    if (uVar1 != 2) {
      snprintf(sock_ntop::str,0x7f,"sock_ntop: unknown AF_xxx: %d, len %d",(ulong)uVar1,(ulong)salen
              );
      sock_ntop::str[0x7f] = '\0';
      return sock_ntop::str;
    }
    pcVar2 = inet_ntop(2,sa->sa_data + 2,sock_ntop::str,0x80);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    uVar1 = *(ushort *)sa->sa_data;
    if (uVar1 == 0) {
      return sock_ntop::str;
    }
    uVar1 = uVar1 << 8 | uVar1 >> 8;
    pcVar2 = ":%d";
    __maxlen = 7;
  }
  snprintf((char *)&uStack_18,__maxlen,pcVar2,(ulong)uVar1);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  strcat(sock_ntop::str,(char *)&uStack_18);
  return sock_ntop::str;
}

Assistant:

char *sock_ntop(const struct sockaddr *sa, socklen_t salen) {
    char portstr[8];
    static char str[128]; /* Unix domain is largest */

    switch (sa->sa_family) {
    case AF_INET: {
        const struct sockaddr_in *sin = (const struct sockaddr_in *)sa;

        if (inet_ntop(AF_INET, &sin->sin_addr, str, sizeof(str)) == NULL)
            return (NULL);
        if (ntohs(sin->sin_port) != 0) {
            snprintf(portstr, sizeof(portstr) - 1, ":%d", ntohs(sin->sin_port));
            portstr[sizeof(portstr) - 1] = '\0';
            strcat(str, portstr);
        }
        return (str);
    }
    /* end sock_ntop */

#ifdef AF_INET6
    case AF_INET6: {
        const struct sockaddr_in6 *sin6 = (const struct sockaddr_in6 *)sa;

        str[0] = '[';
        if (inet_ntop(AF_INET6, &sin6->sin6_addr, str + 1, sizeof(str) - 1) ==
            NULL)
            return (NULL);
        if (ntohs(sin6->sin6_port) != 0) {
            snprintf(portstr, sizeof(portstr), "]:%d", ntohs(sin6->sin6_port));
            portstr[sizeof(portstr) - 1] = '\0';
            strcat(str, portstr);
            return (str);
        }
        return (str + 1);
    }
#endif

    default:
        snprintf(str, sizeof(str) - 1, "sock_ntop: unknown AF_xxx: %d, len %d",
                 sa->sa_family, salen);
        str[sizeof(str) - 1] = '\0';
        return (str);
    }
    return (NULL);
}